

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O1

uint fl_old_shortcut(char *s)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar3 = 0;
  if (s != (char *)0x0) {
    cVar1 = *s;
    uVar3 = 0;
    if ((cVar1 != '\0') &&
       ((s[1] != '\0' ||
        (pvVar6 = memchr("@!",(int)cVar1,3), uVar3 = (int)cVar1, pvVar6 == (void *)0x0)))) {
      bVar11 = cVar1 == '#';
      pcVar4 = s + 1;
      if (!bVar11) {
        pcVar4 = s;
      }
      uVar8 = (ulong)(s[bVar11] == '+');
      uVar3 = (uint)bVar11 * 0x80000 + 0x10000;
      if (s[bVar11] != '+') {
        uVar3 = (uint)bVar11 * 0x80000;
      }
      uVar7 = uVar3 | 0x40000;
      if (pcVar4[uVar8] != '^') {
        uVar7 = uVar3;
      }
      uVar9 = (ulong)(pcVar4[uVar8] == '^');
      lVar5 = uVar9 + uVar8;
      uVar10 = (ulong)(pcVar4[uVar9 + uVar8] == '!');
      uVar3 = uVar7 | 0x400000;
      if (pcVar4[uVar9 + uVar8] != '!') {
        uVar3 = uVar7;
      }
      lVar2 = uVar10 + lVar5;
      bVar11 = pcVar4[uVar10 + lVar5] == '@';
      uVar7 = uVar3 | 0x40000;
      if (!bVar11) {
        uVar7 = uVar3;
      }
      uVar3 = (uint)pcVar4[(ulong)bVar11 + lVar2];
      if ((uVar3 != 0) && ((pcVar4 + (ulong)bVar11 + lVar2)[1] != '\0')) {
        lVar5 = strtol(pcVar4 + (ulong)bVar11 + lVar2,(char **)0x0,0);
        uVar3 = (uint)lVar5;
      }
      uVar3 = uVar3 | uVar7;
    }
  }
  return uVar3;
}

Assistant:

unsigned int fl_old_shortcut(const char* s) {
  if (!s || !*s) return 0;
  if (s[1]==0 && strchr("@!",s[0])) return s[0]; // maintain legacy behavior for "!" and "@"
  unsigned int n = 0;
  if (*s == '#') {n |= FL_ALT; s++;}
  if (*s == '+') {n |= FL_SHIFT; s++;}
  if (*s == '^') {n |= FL_CTRL; s++;}
  if (*s == '!') {n |= FL_META; s++;} 	 // added in 1.3.3
  if (*s == '@') {n |= FL_COMMAND; s++;} // added in 1.3.3
  if (*s && s[1]) return n | (int)strtol(s,0,0); // allow 0xf00 to get any key
  return n | *s;
}